

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testInvalidMeanSquaredErrorLossLayerInputs(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  long lVar4;
  long lVar5;
  Rep *pRVar6;
  CategoricalCrossEntropyLossLayer *pCVar7;
  bool bVar8;
  ModelDescription *pMVar9;
  Type *pTVar10;
  FeatureType *pFVar11;
  ArrayFeatureType *pAVar12;
  TypeUnion TVar13;
  Type *this_00;
  InnerProductLayerParams *this_01;
  WeightParams *pWVar14;
  NetworkUpdateParameters *this_02;
  Type *this_03;
  MeanSquaredErrorLossLayer *this_04;
  ostream *poVar15;
  int iVar16;
  Result res;
  Model m;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar9 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar9);
    local_50.description_ = pMVar9;
  }
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar10->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pTVar10->type_ == (FeatureType *)0x0) {
    pFVar11 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar11);
    pTVar10->type_ = pFVar11;
  }
  pFVar11 = pTVar10->type_;
  if (pFVar11->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 5;
    pAVar12 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar12);
    (pFVar11->Type_).multiarraytype_ = pAVar12;
  }
  if (pTVar10->type_ == (FeatureType *)0x0) {
    pFVar11 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar11);
    pTVar10->type_ = pFVar11;
  }
  pFVar11 = pTVar10->type_;
  if (pFVar11->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 5;
    pAVar12 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar12);
    (pFVar11->Type_).multiarraytype_ = pAVar12;
  }
  pAVar12 = (pFVar11->Type_).multiarraytype_;
  pAVar12->datatype_ = 0x10020;
  this = &pAVar12->shape_;
  iVar2 = (pAVar12->shape_).total_size_;
  if ((pAVar12->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar12->shape_).current_size_;
  iVar16 = iVar2 + 1;
  (pAVar12->shape_).current_size_ = iVar16;
  ((pAVar12->shape_).rep_)->elements[iVar2] = 1;
  iVar2 = (pAVar12->shape_).total_size_;
  if (iVar16 == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar12->shape_).current_size_;
  iVar16 = iVar2 + 1;
  (pAVar12->shape_).current_size_ = iVar16;
  ((pAVar12->shape_).rep_)->elements[iVar2] = 1;
  iVar2 = (pAVar12->shape_).total_size_;
  if (iVar16 == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar12->shape_).current_size_;
  (pAVar12->shape_).current_size_ = iVar2 + 1;
  ((pAVar12->shape_).rep_)->elements[iVar2] = 1;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar9 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar9);
    local_50.description_ = pMVar9;
  }
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar10->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pTVar10->type_ == (FeatureType *)0x0) {
    pFVar11 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar11);
    pTVar10->type_ = pFVar11;
  }
  pFVar11 = pTVar10->type_;
  if (pFVar11->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 5;
    pAVar12 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar12);
    (pFVar11->Type_).multiarraytype_ = pAVar12;
  }
  ((pFVar11->Type_).multiarraytype_)->datatype_ = 0x10020;
  local_50.isupdatable_ = true;
  local_50.specificationversion_ = 4;
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    TVar13.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar13.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = TVar13.pipelineclassifier_;
  }
  TVar13 = local_50.Type_;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"inner_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"B");
  this_00->isupdatable_ = true;
  if (this_00->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01);
    (this_00->layer_).innerproduct_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  *(undefined8 *)&pCVar3->_kernelsize_cached_byte_size_ = 1;
  (pCVar3->stride_).current_size_ = 1;
  (pCVar3->stride_).total_size_ = 0;
  lVar4._0_4_ = (pCVar3->kernelsize_).current_size_;
  lVar4._4_4_ = (pCVar3->kernelsize_).total_size_;
  if (lVar4 == 0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    *(WeightParams **)&pCVar3->kernelsize_ = pWVar14;
  }
  lVar4 = *(long *)&pCVar3->kernelsize_;
  if (*(int *)(lVar4 + 0x10) == *(int *)(lVar4 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar4 + 0x10),*(int *)(lVar4 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar4 + 0x10);
  *(int *)(lVar4 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar4 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  lVar5._0_4_ = (pCVar3->kernelsize_).current_size_;
  lVar5._4_4_ = (pCVar3->kernelsize_).total_size_;
  if (lVar5 == 0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    *(WeightParams **)&pCVar3->kernelsize_ = pWVar14;
  }
  *(undefined1 *)(*(long *)&pCVar3->kernelsize_ + 0x48) = 1;
  *(undefined1 *)&(pCVar3->stride_).rep_ = 1;
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    (pCVar3->kernelsize_).rep_ = (Rep *)pWVar14;
  }
  pRVar6 = (pCVar3->kernelsize_).rep_;
  iVar2 = *(int *)((long)&pRVar6[1].arena + 4);
  if (*(int *)&pRVar6[1].arena == iVar2) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)(pRVar6 + 1),iVar2 + 1);
  }
  iVar2 = *(int *)&pRVar6[1].arena;
  *(int *)&pRVar6[1].arena = iVar2 + 1;
  *(undefined4 *)(pRVar6[1].elements[0] + 8 + (long)iVar2 * 4) = 0x3f800000;
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    (pCVar3->kernelsize_).rep_ = (Rep *)pWVar14;
  }
  *(undefined1 *)(pCVar3->kernelsize_).rep_[4].elements = 1;
  if ((TVar13.neuralnetworkregressor_)->updateparams_ == (NetworkUpdateParameters *)0x0) {
    this_02 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this_02);
    (TVar13.neuralnetworkregressor_)->updateparams_ = this_02;
  }
  this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&((TVar13.neuralnetworkregressor_)->updateparams_->losslayers_).
                        super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"mse_loss_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_03->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (this_03->_oneof_case_[0] != 0xb) {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_03);
    this_03->_oneof_case_[0] = 0xb;
    this_04 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
    CoreML::Specification::MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(this_04);
    (this_03->LossLayerType_).meansquarederrorlosslayer_ = this_04;
  }
  pCVar7 = (this_03->LossLayerType_).categoricalcrossentropylosslayer_;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"C","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pCVar7->input_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"label_target","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pCVar7->target_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  CoreML::Model::validate((Result *)local_78,&local_50);
  bVar8 = CoreML::Result::good((Result *)local_78);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1fc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar8;
}

Assistant:

int testInvalidMeanSquaredErrorLossLayerInputs() {

    /* at least one of the inputs of the loss layer must be produced within the inference network,
     otherwise the model is invalid.
     */

    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    shape->add_shape(1);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    m.set_isupdatable(true);
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto *nn = m.mutable_neuralnetwork();
    auto *l1 = nn->add_layers();
    l1->set_name("inner_layer");
    l1->add_input("A");
    l1->add_output("B");
    l1->set_isupdatable(true);
    Specification::InnerProductLayerParams *innerProductParams = l1->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);
    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(true);

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("mse_loss_layer");

    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input("C");
    mseLossLayer->set_target("label_target");

    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}